

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  string local_50;
  undefined1 local_30 [8];
  ScopedElement e;
  
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase).m_sectionStack);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"OverallResults",(allocator<char> *)((long)&e.m_writer + 7));
    XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->m_xml);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"successes",(allocator<char> *)((long)&e.m_writer + 7));
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_30,&local_50,&(sectionStats->assertions).passed);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"failures",(allocator<char> *)((long)&e.m_writer + 7));
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_30,&local_50,&(sectionStats->assertions).failed);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"expectedFailures",(allocator<char> *)((long)&e.m_writer + 7));
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_30,&local_50,&(sectionStats->assertions).failedButOk);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
              _vptr_NonCopyable[0xc])();
    if (iVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"durationInSeconds",(allocator<char> *)((long)&e.m_writer + 7))
      ;
      XmlWriter::writeAttribute<double>
                ((XmlWriter *)local_30,&local_50,&sectionStats->durationInSeconds);
      std::__cxx11::string::~string((string *)&local_50);
    }
    XmlWriter::endElement(&this->m_xml);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& sectionStats ) CATCH_OVERRIDE {
            StreamingReporterBase::sectionEnded( sectionStats );
            if( --m_sectionDepth > 0 ) {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes", sectionStats.assertions.passed );
                e.writeAttribute( "failures", sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures", sectionStats.assertions.failedButOk );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds", sectionStats.durationInSeconds );

                m_xml.endElement();
            }
        }